

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O0

saidx_t sort_typeBstar(sauchar_t *T,saidx_t *SA,saidx_t *bucket_A,saidx_t *bucket_B,saidx_t n)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  saidx_t *buf_00;
  sauchar_t *psVar5;
  saidx_t *ISA;
  uint uVar6;
  int iVar7;
  saidx_t *in_RCX;
  saidx_t *in_RDX;
  sauchar_t *in_RSI;
  long in_RDI;
  int in_R8D;
  saidx_t unaff_retaddr;
  saidx_t in_stack_00000008;
  saint_t in_stack_00000010;
  saint_t c1;
  saint_t c0;
  saidx_t bufsize;
  saidx_t m;
  saidx_t t;
  saidx_t k;
  saidx_t j;
  saidx_t i;
  saidx_t *buf;
  saidx_t *ISAb;
  saidx_t *PAb;
  uint local_6c;
  uint local_60;
  uint local_5c;
  int local_54;
  saidx_t in_stack_ffffffffffffffb4;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 in_stack_ffffffffffffffd8;
  
  for (iVar9 = 0; iVar9 < 0x100; iVar9 = iVar9 + 1) {
    in_RDX[iVar9] = 0;
  }
  for (iVar9 = 0; iVar9 < 0x10000; iVar9 = iVar9 + 1) {
    in_RCX[iVar9] = 0;
  }
  uVar3 = in_R8D - 1;
  local_5c = (uint)*(byte *)(in_RDI + (in_R8D + -1));
  local_54 = in_R8D;
  while (-1 < (int)uVar3) {
    do {
      uVar10 = uVar3;
      uVar6 = local_5c;
      in_RDX[(int)local_5c] = in_RDX[(int)local_5c] + 1;
      uVar3 = uVar10 - 1;
      bVar2 = false;
      if (-1 < (int)uVar3) {
        bVar2 = local_5c <= *(byte *)(in_RDI + (int)uVar3);
        local_5c = (uint)*(byte *)(in_RDI + (int)uVar3);
      }
    } while (bVar2);
    if (uVar3 < 0x80000000) {
      uVar6 = local_5c << 8 | uVar6;
      in_RCX[(int)uVar6] = in_RCX[(int)uVar6] + 1;
      local_54 = local_54 + -1;
      *(uint *)(in_RSI + (long)local_54 * 4) = uVar3;
      uVar3 = uVar10 - 2;
      while( true ) {
        uVar6 = local_5c;
        bVar2 = false;
        if (-1 < (int)uVar3) {
          bVar1 = *(byte *)(in_RDI + (int)uVar3);
          bVar2 = bVar1 == local_5c || bVar1 < local_5c;
          local_5c = (uint)bVar1;
        }
        if (!bVar2) break;
        uVar6 = uVar6 << 8 | local_5c;
        in_RCX[(int)uVar6] = in_RCX[(int)uVar6] + 1;
        uVar3 = uVar3 - 1;
      }
    }
  }
  local_54 = in_R8D - local_54;
  iVar9 = 0;
  iVar8 = 0;
  for (local_5c = 0; (int)local_5c < 0x100; local_5c = local_5c + 1) {
    iVar4 = in_RDX[(int)local_5c];
    in_RDX[(int)local_5c] = iVar9 + iVar8;
    iVar9 = iVar9 + iVar4 + in_RCX[(int)(local_5c << 8 | local_5c)];
    local_60 = local_5c;
    while (local_60 = local_60 + 1, (int)local_60 < 0x100) {
      iVar8 = in_RCX[(int)(local_5c << 8 | local_60)] + iVar8;
      in_RCX[(int)(local_5c << 8 | local_60)] = iVar8;
      iVar9 = in_RCX[(int)(local_60 * 0x100 | local_5c)] + iVar9;
    }
  }
  if (0 < local_54) {
    buf_00 = (saidx_t *)(in_RSI + (long)local_54 * -4 + (long)in_R8D * 4);
    psVar5 = in_RSI + (long)local_54 * 4;
    for (iVar9 = local_54 + -2; -1 < iVar9; iVar9 = iVar9 + -1) {
      uVar3 = (uint)CONCAT11(*(undefined1 *)(in_RDI + buf_00[iVar9]),
                             *(undefined1 *)(in_RDI + (buf_00[iVar9] + 1)));
      iVar8 = in_RCX[(int)uVar3];
      in_RCX[(int)uVar3] = iVar8 + -1;
      *(int *)(in_RSI + (long)(iVar8 + -1) * 4) = iVar9;
    }
    iVar9 = buf_00[local_54 + -1];
    uVar3 = (uint)CONCAT11(*(undefined1 *)(in_RDI + iVar9),*(undefined1 *)(in_RDI + (iVar9 + 1)));
    iVar8 = in_RCX[(int)uVar3];
    in_RCX[(int)uVar3] = iVar8 + -1;
    *(int *)(in_RSI + (long)(iVar8 + -1) * 4) = local_54 + -1;
    ISA = (saidx_t *)(in_RSI + (long)local_54 * 4);
    local_5c = 0xfe;
    iVar8 = local_54;
    while (0 < iVar8) {
      for (local_60 = 0xff; (int)local_5c < (int)local_60; local_60 = local_60 - 1) {
        iVar4 = in_RCX[(int)(local_5c << 8 | local_60)];
        iVar7 = iVar8 - iVar4;
        iVar8 = iVar4;
        if (1 < iVar7) {
          sssort(in_RSI,in_RDX,in_RCX,(saidx_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),buf_00,
                 (saidx_t)((ulong)psVar5 >> 0x20),unaff_retaddr,in_stack_00000008,in_stack_00000010)
          ;
          iVar8 = iVar4;
        }
      }
      local_5c = local_5c + -1;
    }
    iVar4 = local_54 + -1;
    while (iVar7 = iVar8, iVar8 = iVar4, -1 < iVar4) {
      if (-1 < *(int *)(in_RSI + (long)iVar4 * 4)) {
        do {
          iVar7 = iVar8;
          *(int *)(psVar5 + (long)*(int *)(in_RSI + (long)iVar7 * 4) * 4) = iVar7;
          iVar8 = iVar7 + -1;
          bVar2 = false;
          if (-1 < iVar8) {
            bVar2 = -1 < *(int *)(in_RSI + (long)iVar8 * 4);
          }
        } while (bVar2);
        *(int *)(in_RSI + (long)iVar7 * 4) = iVar8 - iVar4;
        iVar7 = iVar4;
        iVar4 = iVar8;
        if (iVar8 < 1) break;
      }
      do {
        iVar7 = iVar4;
        uVar3 = *(uint *)(in_RSI + (long)iVar7 * 4);
        *(uint *)(in_RSI + (long)iVar7 * 4) = uVar3 ^ 0xffffffff;
        *(int *)(psVar5 + (long)(int)(uVar3 ^ 0xffffffff) * 4) = iVar8;
        iVar4 = iVar7 + -1;
      } while (*(int *)(in_RSI + (long)iVar4 * 4) < 0);
      *(int *)(psVar5 + (long)*(int *)(in_RSI + (long)iVar4 * 4) * 4) = iVar8;
      iVar4 = iVar7 + -2;
    }
    trsort(ISA,(saidx_t *)CONCAT44(iVar8,iVar7),in_stack_ffffffffffffffb4,iVar9);
    bVar1 = *(byte *)(in_RDI + (in_R8D + -1));
    iVar9 = local_54;
    uVar3 = in_R8D - 1;
    while (-1 < (int)uVar3) {
      do {
        uVar6 = uVar3;
        local_6c = uVar6 - 1;
        bVar2 = false;
        if (-1 < (int)local_6c) {
          bVar2 = bVar1 <= *(byte *)(in_RDI + (int)local_6c);
          bVar1 = *(byte *)(in_RDI + (int)local_6c);
        }
        uVar3 = local_6c;
      } while (bVar2);
      if (local_6c < 0x80000000) {
        uVar3 = uVar6 - 2;
        while( true ) {
          bVar2 = false;
          if (-1 < (int)uVar3) {
            bVar2 = *(byte *)(in_RDI + (int)uVar3) <= bVar1;
            bVar1 = *(byte *)(in_RDI + (int)uVar3);
          }
          if (!bVar2) break;
          uVar3 = uVar3 - 1;
        }
        if ((local_6c != 0) && ((int)(local_6c - uVar3) < 2)) {
          local_6c = local_6c ^ 0xffffffff;
        }
        iVar9 = iVar9 + -1;
        *(uint *)(in_RSI + (long)*(int *)(psVar5 + (long)iVar9 * 4) * 4) = local_6c;
      }
    }
    in_RCX[0xffff] = in_R8D;
    iVar9 = local_54 + -1;
    for (local_5c = 0xfe; -1 < (int)local_5c; local_5c = local_5c - 1) {
      iVar8 = in_RDX[(int)(local_5c + 1)] + -1;
      for (local_60 = 0xff; (int)local_5c < (int)local_60; local_60 = local_60 - 1) {
        iVar4 = iVar8 - in_RCX[(int)(local_60 << 8 | local_5c)];
        in_RCX[(int)(local_60 << 8 | local_5c)] = iVar8;
        iVar8 = in_RCX[(int)(local_5c << 8 | local_60)];
        for (; iVar8 <= iVar9; iVar9 = iVar9 + -1) {
          *(undefined4 *)(in_RSI + (long)iVar4 * 4) = *(undefined4 *)(in_RSI + (long)iVar9 * 4);
          iVar4 = iVar4 + -1;
        }
        iVar8 = iVar4;
      }
      in_RCX[(int)(local_5c << 8 | local_5c + 1)] =
           (iVar8 - in_RCX[(int)(local_5c << 8 | local_5c)]) + 1;
      in_RCX[(int)(local_5c << 8 | local_5c)] = iVar8;
    }
  }
  return local_54;
}

Assistant:

static
saidx_t
sort_typeBstar(const sauchar_t *T, saidx_t *SA,
               saidx_t *bucket_A, saidx_t *bucket_B,
               saidx_t n) {
  saidx_t *PAb, *ISAb, *buf;
#ifdef _OPENMP
  saidx_t *curbuf;
  saidx_t l;
#endif
  saidx_t i, j, k, t, m, bufsize;
  saint_t c0, c1;
#ifdef _OPENMP
  saint_t d0, d1;
  int tmp;
#endif

  /* Initialize bucket arrays. */
  for(i = 0; i < BUCKET_A_SIZE; ++i) { bucket_A[i] = 0; }
  for(i = 0; i < BUCKET_B_SIZE; ++i) { bucket_B[i] = 0; }

  /* Count the number of occurrences of the first one or two characters of each
     type A, B and B* suffix. Moreover, store the beginning position of all
     type B* suffixes into the array SA. */
  for(i = n - 1, m = n, c0 = T[n - 1]; 0 <= i;) {
    /* type A suffix. */
    do { ++BUCKET_A(c1 = c0); } while((0 <= --i) && ((c0 = T[i]) >= c1));
    if(0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(c0, c1);
      SA[--m] = i;
      /* type B suffix. */
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) {
        ++BUCKET_B(c0, c1);
      }
    }
  }
  m = n - m;
/*
note:
  A type B* suffix is lexicographically smaller than a type B suffix that
  begins with the same first two characters.
*/

  /* Calculate the index of start/end point of each bucket. */
  for(c0 = 0, i = 0, j = 0; c0 < ALPHABET_SIZE; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0) = i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for(c1 = c0 + 1; c1 < ALPHABET_SIZE; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if(0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    PAb = SA + n - m; ISAb = SA + m;
    for(i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
#ifdef _OPENMP
    tmp = omp_get_max_threads();
    buf = SA + m, bufsize = (n - (2 * m)) / tmp;
    c0 = ALPHABET_SIZE - 2, c1 = ALPHABET_SIZE - 1, j = m;
#pragma omp parallel default(shared) private(curbuf, k, l, d0, d1, tmp)
    {
      tmp = omp_get_thread_num();
      curbuf = buf + tmp * bufsize;
      k = 0;
      for(;;) {
        #pragma omp critical(sssort_lock)
        {
          if(0 < (l = j)) {
            d0 = c0, d1 = c1;
            do {
              k = BUCKET_BSTAR(d0, d1);
              if(--d1 <= d0) {
                d1 = ALPHABET_SIZE - 1;
                if(--d0 < 0) { break; }
              }
            } while(((l - k) <= 1) && (0 < (l = k)));
            c0 = d0, c1 = d1, j = k;
          }
        }
        if(l == 0) { break; }
        sssort(T, PAb, SA + k, SA + l,
               curbuf, bufsize, 2, n, *(SA + k) == (m - 1));
      }
    }
#else
    buf = SA + m, bufsize = n - (2 * m);
    for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
        i = BUCKET_BSTAR(c0, c1);
        if(1 < (j - i)) {
          sssort(T, PAb, SA + i, SA + j,
                 buf, bufsize, 2, n, *(SA + i) == (m - 1));
        }
      }
    }
#endif

    /* Compute ranks of type B* substrings. */
    for(i = m - 1; 0 <= i; --i) {
      if(0 <= SA[i]) {
        j = i;
        do { ISAb[SA[i]] = i; } while((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if(i <= 0) { break; }
      }
      j = i;
      do { ISAb[SA[i] = ~SA[i]] = j; } while(SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using trsort. */
    trsort(ISAb, SA, m, 1);

    /* Set the sorted order of tyoe B* suffixes. */
    for(i = n - 1, j = m, c0 = T[n - 1]; 0 <= i;) {
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) >= c1); --i, c1 = c0) { }
      if(0 <= i) {
        t = i;
        for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) { }
        SA[ISAb[--j]] = ((t == 0) || (1 < (t - i))) ? t : ~t;
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    BUCKET_B(ALPHABET_SIZE - 1, ALPHABET_SIZE - 1) = n; /* end point */
    for(c0 = ALPHABET_SIZE - 2, k = m - 1; 0 <= c0; --c0) {
      i = BUCKET_A(c0 + 1) - 1;
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for(i = t, j = BUCKET_BSTAR(c0, c1);
            j <= k;
            --i, --k) { SA[i] = SA[k]; }
      }
      BUCKET_BSTAR(c0, c0 + 1) = i - BUCKET_B(c0, c0) + 1; /* start point */
      BUCKET_B(c0, c0) = i; /* end point */
    }
  }

  return m;
}